

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# humain.cpp
# Opt level: O0

void free(void *__ptr)

{
  bool bVar1;
  hu_recursion_checker local_1d [8];
  hu_recursion_checker recursion_checker;
  void *ptr_local;
  
  if (hu_bypass) {
    __libc_free(__ptr);
  }
  else {
    hu_recursion_checker::hu_recursion_checker(local_1d);
    bVar1 = hu_recursion_checker::is_recursive_call(local_1d);
    if (bVar1) {
      __libc_free(__ptr);
    }
    else {
      if ((hu_enable_humalloc & 1U) == 0) {
        __libc_free(__ptr);
      }
      else {
        hu_free(__ptr);
      }
      log_event(2,__ptr,0);
    }
    hu_recursion_checker::~hu_recursion_checker(local_1d);
  }
  return;
}

Assistant:

void free(void* ptr)
{
  if (hu_bypass) return __libc_free(ptr);

  hu_recursion_checker recursion_checker;
  if (recursion_checker.is_recursive_call()) return __libc_free(ptr);

  hu_enable_humalloc ? hu_free(ptr) : __libc_free(ptr);
  log_event(EVENT_FREE, ptr, 0);
}